

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedPipelinePostFS::Run(AdvancedPipelinePostFS *this)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  undefined1 auVar1 [16];
  bool bVar2;
  GLuint GVar3;
  undefined4 extraout_EAX;
  int iVar4;
  bool *compile_error;
  bool *compile_error_00;
  bool *compile_error_01;
  size_t i_1;
  ulong uVar5;
  int i;
  long lVar6;
  ulong uVar7;
  allocator<char> local_8a;
  allocator<char> local_89;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  string local_68;
  Vector<float,_4> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,
             "\nconst vec2 g_vertex[4] = vec2[4](vec2(0), vec2(-1, -1), vec2(3, -1), vec2(-1, 3));\nvoid main() {\n  gl_Position = vec4(g_vertex[gl_VertexID], 0, 1);\n}"
             ,&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(1, 0, 0, 1);\n}"
             ,&local_8a);
  GVar3 = ComputeShaderBase::CreateProgram(&this->super_ComputeShaderBase,(string *)&data,&local_68)
  ;
  this->m_program[0] = GVar3;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&data);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[0]);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program[0],compile_error);
  lVar6 = -1;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&data,
               "\n#define TILE_WIDTH 16\n#define TILE_HEIGHT 16\nconst ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);\n\nlayout(binding = 0, rgba32f) uniform image2D g_input_image;\nlayout(binding = 1, rgba32f) uniform image2D g_output_image;\n\nlayout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;\n\nvoid main() {\n  const ivec2 tile_xy = ivec2(gl_WorkGroupID);\n  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n\n  if (thread_xy == ivec2(0)) {\n    const ivec2 pixel_xy = tile_xy * kTileSize;\n    for (int y = 0; y < TILE_HEIGHT; ++y) {\n      for (int x = 0; x < TILE_WIDTH; ++x) {\n        imageStore(g_output_image, pixel_xy + ivec2(x, y), vec4(0, 1, 0, 1));\n      }\n    }\n  }\n}"
               ,(allocator<char> *)&local_68);
    GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)&data);
    this->m_program[1] = GVar3;
    std::__cxx11::string::~string((string *)&data);
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[1]);
    bVar2 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[1],compile_error_00);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&data,
                 "\n#define TILE_WIDTH 32\n#define TILE_HEIGHT 32\nconst ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);\n\nlayout(binding = 0, rgba32f) uniform image2D g_input_image;\nlayout(binding = 1, rgba32f) uniform image2D g_output_image;\n\nlayout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;\n\nvec4 Process(vec4 ic) {\n  return ic + vec4(1, 0, 0, 0);\n}\nvoid main() {\n  const ivec2 tile_xy = ivec2(gl_WorkGroupID);\n  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n  const ivec2 pixel_xy = tile_xy * kTileSize + thread_xy;\n  vec4 ic = imageLoad(g_input_image, pixel_xy);\n  imageStore(g_output_image, pixel_xy, Process(ic));\n}"
                 ,(allocator<char> *)&local_68);
      GVar3 = ComputeShaderBase::CreateComputeProgram
                        (&this->super_ComputeShaderBase,(string *)&data);
      this->m_program[2] = GVar3;
      std::__cxx11::string::~string((string *)&data);
      glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[2]);
      bVar2 = ComputeShaderBase::CheckProgram
                        (&this->super_ComputeShaderBase,this->m_program[2],compile_error_01);
      if (bVar2) {
        glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  (&data,0x4000,(allocator_type *)&local_68);
        textures = this->m_render_target;
        glu::CallLogWrapper::glGenTextures(this_00,2,textures);
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          glu::CallLogWrapper::glBindTexture(this_00,0xde1,textures[lVar6]);
          glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
          glu::CallLogWrapper::glTexImage2D
                    (this_00,0xde1,0,0x8814,0x80,0x80,0,0x1908,0x1406,
                     data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
        glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
        std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
        ~_Vector_base(&data.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     );
        glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->m_framebuffer);
        glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_framebuffer);
        glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->m_render_target[0],0);
        glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,0);
        glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_framebuffer);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glViewport(this_00,0,0,0x80,0x80);
        glu::CallLogWrapper::glDrawArrays(this_00,4,1,3);
        glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,0);
        glu::CallLogWrapper::glBindImageTexture
                  (this_00,0,this->m_render_target[0],0,'\0',0,35000,0x8814);
        glu::CallLogWrapper::glBindImageTexture
                  (this_00,1,this->m_render_target[1],0,'\0',0,0x88b9,0x8814);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
        glu::CallLogWrapper::glDispatchCompute(this_00,8,8,1);
        glu::CallLogWrapper::glBindImageTexture
                  (this_00,0,this->m_render_target[1],0,'\0',0,35000,0x8814);
        glu::CallLogWrapper::glBindImageTexture
                  (this_00,1,this->m_render_target[0],0,'\0',0,0x88b9,0x8814);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[2]);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
        glu::CallLogWrapper::glDispatchCompute(this_00,4,4,1);
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  (&data,0x4000,(allocator_type *)&local_68);
        glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
        glu::CallLogWrapper::glGetTexImage
                  (this_00,0xde1,0,0x1908,0x1406,
                   data.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        lVar6 = 0;
        uVar5 = 0;
        while( true ) {
          uVar7 = (long)data.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)data.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4;
          if (uVar7 <= uVar5) break;
          tcu::Vector<float,_4>::Vector
                    (&local_48,
                     (Vector<float,_4> *)
                     ((long)(data.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar6));
          auVar1._4_4_ = -(uint)(local_48.m_data[1] != 1.0);
          auVar1._0_4_ = -(uint)(local_48.m_data[0] != 1.0);
          auVar1._8_4_ = -(uint)(local_48.m_data[2] != 0.0);
          auVar1._12_4_ = -(uint)(local_48.m_data[3] != 1.0);
          iVar4 = movmskps(extraout_EAX,auVar1);
          if (iVar4 != 0) {
            anon_unknown_0::Output("Invalid data at index %d.\n",uVar5);
            break;
          }
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0x10;
        }
        std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
        ~_Vector_base(&data.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     );
        lVar6 = -(ulong)(uVar5 < uVar7);
      }
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			NL "const vec2 g_vertex[4] = vec2[4](vec2(0), vec2(-1, -1), vec2(3, -1), vec2(-1, 3));" NL
			   "void main() {" NL "  gl_Position = vec4(g_vertex[gl_VertexID], 0, 1);" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_color;" NL "void main() {" NL "  g_color = vec4(1, 0, 0, 1);" NL "}";

		m_program[0] = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		const char* const glsl_cs =
			NL "#define TILE_WIDTH 16" NL "#define TILE_HEIGHT 16" NL
			   "const ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);" NL NL
			   "layout(binding = 0, rgba32f) uniform image2D g_input_image;" NL
			   "layout(binding = 1, rgba32f) uniform image2D g_output_image;" NL	NL
			   "layout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;" NL NL "void main() {" NL
			   "  const ivec2 tile_xy = ivec2(gl_WorkGroupID);" NL
			   "  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);" NL NL "  if (thread_xy == ivec2(0)) {" NL
			   "    const ivec2 pixel_xy = tile_xy * kTileSize;" NL "    for (int y = 0; y < TILE_HEIGHT; ++y) {" NL
			   "      for (int x = 0; x < TILE_WIDTH; ++x) {" NL
			   "        imageStore(g_output_image, pixel_xy + ivec2(x, y), vec4(0, 1, 0, 1));" NL "      }" NL
			   "    }" NL "  }" NL "}";

		m_program[1] = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;

		const char* const glsl_cs2 = NL "#define TILE_WIDTH 32" NL "#define TILE_HEIGHT 32" NL
										"const ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);" NL NL
										"layout(binding = 0, rgba32f) uniform image2D g_input_image;" NL
										"layout(binding = 1, rgba32f) uniform image2D g_output_image;" NL	NL
										"layout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;" NL NL
										"vec4 Process(vec4 ic) {" NL "  return ic + vec4(1, 0, 0, 0);" NL "}" NL
										"void main() {" NL "  const ivec2 tile_xy = ivec2(gl_WorkGroupID);" NL
										"  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);" NL
										"  const ivec2 pixel_xy = tile_xy * kTileSize + thread_xy;" NL
										"  vec4 ic = imageLoad(g_input_image, pixel_xy);" NL
										"  imageStore(g_output_image, pixel_xy, Process(ic));" NL "}";
		m_program[2] = CreateComputeProgram(glsl_cs2);
		glLinkProgram(m_program[2]);
		if (!CheckProgram(m_program[2]))
			return ERROR;

		glGenVertexArrays(1, &m_vertex_array);

		/* init render targets */
		{
			std::vector<vec4> data(128 * 128);
			glGenTextures(2, m_render_target);
			for (int i = 0; i < 2; ++i)
			{
				glBindTexture(GL_TEXTURE_2D, m_render_target[i]);
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
				glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 128, 128, 0, GL_RGBA, GL_FLOAT, &data[0][0]);
			}
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glGenFramebuffers(1, &m_framebuffer);
		glBindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_render_target[0], 0);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		glBindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
		glUseProgram(m_program[0]);
		glBindVertexArray(m_vertex_array);
		glClear(GL_COLOR_BUFFER_BIT);
		glViewport(0, 0, 128, 128);
		// draw full-viewport triangle
		glDrawArrays(GL_TRIANGLES, 1,
					 3); // note: <first> is 1 this means that gl_VertexID in the VS will be: 1, 2 and 3
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		glBindImageTexture(0, m_render_target[0], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);  // input
		glBindImageTexture(1, m_render_target[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F); // output
		glUseProgram(m_program[1]);
		glDispatchCompute(128 / 16, 128 / 16, 1);

		glBindImageTexture(0, m_render_target[1], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);  // input
		glBindImageTexture(1, m_render_target[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F); // output
		glUseProgram(m_program[2]);
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(128 / 32, 128 / 32, 1);

		/* validate render target */
		{
			std::vector<vec4> data(128 * 128);
			glBindTexture(GL_TEXTURE_2D, m_render_target[0]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &data[0][0]);
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!IsEqual(data[i], vec4(1, 1, 0, 1)))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}